

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_set1_requested_trust_anchors(SSL *ssl,uint8_t *ids,size_t ids_len)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  pointer pSVar2;
  size_t extraout_RDX;
  Span<const_unsigned_char> in_00;
  undefined1 local_58 [8];
  Array<unsigned_char> copy;
  undefined1 auStack_38 [8];
  Span<const_unsigned_char> span;
  size_t ids_len_local;
  uint8_t *ids_local;
  SSL *ssl_local;
  
  span.size_ = ids_len;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)auStack_38,ids,span.size_);
    copy.size_ = (size_t)auStack_38;
    in_00.size_ = extraout_RDX;
    in_00.data_ = span.data_;
    bVar1 = bssl::ssl_is_valid_trust_anchor_list((bssl *)auStack_38,in_00);
    if (bVar1) {
      bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)local_58);
      in.size_ = (size_t)span.data_;
      in.data_ = (uchar *)auStack_38;
      bVar1 = bssl::Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_58,in);
      if (bVar1) {
        pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                           (&ssl->config);
        std::optional<bssl::Array<unsigned_char>>::operator=
                  ((optional<bssl::Array<unsigned_char>> *)&pSVar2->requested_trust_anchors,
                   (Array<unsigned_char> *)local_58);
      }
      ssl_local._4_4_ = (uint)bVar1;
      bssl::Array<unsigned_char>::~Array((Array<unsigned_char> *)local_58);
    }
    else {
      ERR_put_error(0x10,0,0x148,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0xd6a);
      ssl_local._4_4_ = 0;
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_requested_trust_anchors(SSL *ssl, const uint8_t *ids,
                                     size_t ids_len) {
  if (!ssl->config) {
    return 0;
  }
  auto span = Span(ids, ids_len);
  if (!ssl_is_valid_trust_anchor_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_TRUST_ANCHOR_LIST);
    return 0;
  }
  Array<uint8_t> copy;
  if (!copy.CopyFrom(span)) {
    return 0;
  }
  ssl->config->requested_trust_anchors = std::move(copy);
  return 1;
}